

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionDispatcher.cpp
# Opt level: O0

bool __thiscall
btCollisionDispatcher::needsCollision
          (btCollisionDispatcher *this,btCollisionObject *body0,btCollisionObject *body1)

{
  bool bVar1;
  btCollisionObject *in_RDX;
  bool needsCollision;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar2;
  
  bVar2 = 1;
  bVar1 = btCollisionObject::isActive((btCollisionObject *)CONCAT17(1,in_stack_ffffffffffffffe0));
  if ((bVar1) ||
     (bVar1 = btCollisionObject::isActive
                        ((btCollisionObject *)CONCAT17(bVar2,in_stack_ffffffffffffffe0)), bVar1)) {
    bVar1 = btCollisionObject::checkCollideWith
                      (in_RDX,(btCollisionObject *)CONCAT17(bVar2,in_stack_ffffffffffffffe0));
    if ((!bVar1) ||
       (bVar1 = btCollisionObject::checkCollideWith
                          (in_RDX,(btCollisionObject *)CONCAT17(bVar2,in_stack_ffffffffffffffe0)),
       !bVar1)) {
      bVar2 = 0;
    }
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool	btCollisionDispatcher::needsCollision(const btCollisionObject* body0,const btCollisionObject* body1)
{
	btAssert(body0);
	btAssert(body1);

	bool needsCollision = true;

#ifdef BT_DEBUG
	if (!(m_dispatcherFlags & btCollisionDispatcher::CD_STATIC_STATIC_REPORTED))
	{
		//broadphase filtering already deals with this
		if (body0->isStaticOrKinematicObject() && body1->isStaticOrKinematicObject())
		{
			m_dispatcherFlags |= btCollisionDispatcher::CD_STATIC_STATIC_REPORTED;
			printf("warning btCollisionDispatcher::needsCollision: static-static collision!\n");
		}
	}
#endif //BT_DEBUG

	if ((!body0->isActive()) && (!body1->isActive()))
		needsCollision = false;
	else if ((!body0->checkCollideWith(body1)) || (!body1->checkCollideWith(body0)))
		needsCollision = false;
	
	return needsCollision ;

}